

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorProto_ExtensionRange::_internal_has_options
          (DescriptorProto_ExtensionRange *this)

{
  uint32_t *puVar1;
  LogMessage *other;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  byte local_11;
  DescriptorProto_ExtensionRange *pDStack_10;
  bool value;
  DescriptorProto_ExtensionRange *this_local;
  
  pDStack_10 = this;
  puVar1 = internal::HasBits<1UL>::operator[](&this->_has_bits_,0);
  local_11 = (*puVar1 & 1) != 0;
  local_51 = 0;
  if (((bool)local_11) && (this->options_ == (ExtensionRangeOptions *)0x0)) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.h"
               ,0x2455);
    local_51 = 1;
    other = internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: !value || options_ != nullptr: ");
    internal::LogFinisher::operator=(local_65,other);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  return (bool)(local_11 & 1);
}

Assistant:

inline bool DescriptorProto_ExtensionRange::_internal_has_options() const {
  bool value = (_has_bits_[0] & 0x00000001u) != 0;
  PROTOBUF_ASSUME(!value || options_ != nullptr);
  return value;
}